

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O1

void LogTest(void)

{
  Model *this;
  System *s;
  System *t;
  long *plVar1;
  double dVar2;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  this = (Model *)Model::createModel();
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sys1","");
  (**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sys2","");
  (**(code **)(*(long *)this + 0x50))(0x4024000000000000,this,local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"exp","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sys1","");
  s = (System *)(**(code **)(*(long *)this + 0x40))(this,local_88);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"sys2","");
  t = (System *)(**(code **)(*(long *)this + 0x40))(this,local_68);
  Model::createFlow<FlowLog>(this,&local_48,s,t);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (*(code *)**(undefined8 **)this)(this,0,100);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sys1","");
  plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_88);
  dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
  if (ABS(dVar2 + -88.2167) < 0.0001) {
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"sys2","");
    plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_88);
    dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
    if (ABS(dVar2 + -21.7833) < 0.0001) {
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      return;
    }
    __assert_fail("fabs(m->findSystem(\"sys2\")->getValue() - 21.7833) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x19,"void LogTest()");
  }
  __assert_fail("fabs(m->findSystem(\"sys1\")->getValue() - 88.2167) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0x18,"void LogTest()");
}

Assistant:

void LogTest() {
    auto *m = Model::createModel();
    m->createSystem("sys1", 100.0);
     m->createSystem("sys2", 10.0);
    m->createFlow<FlowLog>("exp", m->findSystem("sys1"), m->findSystem("sys2"));
    m->execute(0, 100);

    assert(fabs(m->findSystem("sys1")->getValue() - 88.2167) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 21.7833) < 0.0001);
}